

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_vfs_read(ma_vfs *pVFS,ma_vfs_file file,void *pDst,size_t sizeInBytes,size_t *pBytesRead
                     )

{
  ma_result mVar1;
  ma_result mVar2;
  size_t bytesRead;
  
  if (pBytesRead != (size_t *)0x0) {
    *pBytesRead = 0;
  }
  mVar2 = MA_INVALID_ARGS;
  if (pDst != (void *)0x0 && (file != (ma_vfs_file)0x0 && pVFS != (ma_vfs *)0x0)) {
    if (*(code **)((long)pVFS + 0x18) == (code *)0x0) {
      mVar2 = MA_NOT_IMPLEMENTED;
    }
    else {
      mVar1 = (**(code **)((long)pVFS + 0x18))();
      if (pBytesRead != (size_t *)0x0) {
        *pBytesRead = 0;
      }
      mVar2 = MA_AT_END;
      if (mVar1 != MA_SUCCESS) {
        mVar2 = mVar1;
      }
      if (sizeInBytes == 0) {
        mVar2 = mVar1;
      }
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_vfs_read(ma_vfs* pVFS, ma_vfs_file file, void* pDst, size_t sizeInBytes, size_t* pBytesRead)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;
    ma_result result;
    size_t bytesRead = 0;

    if (pBytesRead != NULL) {
        *pBytesRead = 0;
    }

    if (pVFS == NULL || file == NULL || pDst == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onRead == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    result = pCallbacks->onRead(pVFS, file, pDst, sizeInBytes, &bytesRead);

    if (pBytesRead != NULL) {
        *pBytesRead = bytesRead;
    }

    if (result == MA_SUCCESS && bytesRead == 0 && sizeInBytes > 0) {
        result  = MA_AT_END;
    }

    return result;
}